

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

int __thiscall asmjit::Assembler::bind(Assembler *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long *plVar1;
  CodeHolder *pCVar2;
  long lVar3;
  Logger *pLVar4;
  Slot *pSVar5;
  uint8_t *puVar6;
  Error EVar7;
  long lVar8;
  Slot *pSVar9;
  ulong uVar10;
  undefined4 in_register_00000034;
  uint8_t uVar11;
  int iVar12;
  long lVar13;
  Error EVar14;
  Error EStack_150;
  StringBuilderTmp<256UL> sb;
  
  EVar7 = (this->super_CodeEmitter)._lastError;
  if (EVar7 != 0) {
    return EVar7;
  }
  pCVar2 = (this->super_CodeEmitter)._code;
  if (pCVar2 != (CodeHolder *)0x0) {
    uVar10 = (ulong)(*(int *)(CONCAT44(in_register_00000034,__fd) + 4) - 0x100);
    if ((uVar10 < (pCVar2->_labels).super_ZoneVectorBase._length) &&
       (lVar3 = *(long *)((long)(pCVar2->_labels).super_ZoneVectorBase._data + uVar10 * 8),
       lVar3 != 0)) {
      if (*(int *)(lVar3 + 0x18) == -1) {
        if (((this->super_CodeEmitter)._globalOptions & 4) != 0) {
          sb.super_StringBuilder._data = sb._embeddedData;
          sb._embeddedData[0] = '\0';
          sb.super_StringBuilder._length = 0;
          sb.super_StringBuilder._capacity = 0x100;
          sb.super_StringBuilder._canFree = 0;
          if (*(uint *)(lVar3 + 0x30) == 0) {
            StringBuilder::setFormat(&sb.super_StringBuilder,"L%u:");
          }
          else {
            if (*(uint *)(lVar3 + 0x30) < 0xc) {
              lVar8 = lVar3 + 0x34;
            }
            else {
              lVar8 = *(long *)(lVar3 + 0x38);
            }
            StringBuilder::setFormat(&sb.super_StringBuilder,"%s:",lVar8);
          }
          Logging::formatLine(&sb.super_StringBuilder,(uint8_t *)0x0,
                              (ulong)(((this->super_CodeEmitter)._code)->_logger->_options & 1) - 1,
                              0,0,(this->super_CodeEmitter)._inlineComment);
          pLVar4 = ((this->super_CodeEmitter)._code)->_logger;
          (*pLVar4->_vptr_Logger[2])
                    (pLVar4,sb.super_StringBuilder._data,sb.super_StringBuilder._length);
          StringBuilder::~StringBuilder(&sb.super_StringBuilder);
        }
        lVar8 = (long)this->_bufferPtr - (long)this->_bufferData;
        pSVar9 = *(Slot **)(lVar3 + 0x28);
        EVar7 = 0;
        while( true ) {
          if (pSVar9 == (Slot *)0x0) {
            *(uint32_t *)(lVar3 + 0x18) = this->_section->_id;
            *(long *)(lVar3 + 0x20) = lVar8;
            *(undefined8 *)(lVar3 + 0x28) = 0;
            (this->super_CodeEmitter)._inlineComment = (char *)0x0;
            if (EVar7 != 0) {
              EVar7 = CodeEmitter::setLastError(&this->super_CodeEmitter,EVar7,(char *)0x0);
              return EVar7;
            }
            return 0;
          }
          uVar10 = (ulong)*(uint *)((long)&pSVar9[1].next + 4);
          if (uVar10 == 0xffffffff) {
            pSVar5 = pSVar9[2].next;
            puVar6 = this->_bufferData;
            lVar13 = (lVar8 - (long)pSVar5) + (long)pSVar9[3].next;
            iVar12 = (int)lVar13;
            EVar14 = 0x2a;
            if (puVar6[(long)pSVar5] == '\x01') {
              uVar11 = (uint8_t)lVar13;
              if ((char)uVar11 == iVar12) {
                puVar6[(long)pSVar5] = uVar11;
                EVar14 = EVar7;
              }
            }
            else if (puVar6[(long)pSVar5] == '\x04') {
              *(int *)(puVar6 + (long)pSVar5) = iVar12;
              EVar14 = EVar7;
            }
          }
          else {
            pCVar2 = (this->super_CodeEmitter)._code;
            if ((pCVar2->_relocations).super_ZoneVectorBase._length <= uVar10) {
              DebugUtils::assertionFailed
                        ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/../base/../base/../base/zone.h"
                         ,0x31b,"i < _length");
            }
            plVar1 = (long *)(*(long *)((long)(pCVar2->_relocations).super_ZoneVectorBase._data +
                                       uVar10 * 8) + 0x18);
            *plVar1 = *plVar1 + lVar8;
            EVar14 = EVar7;
          }
          pCVar2 = (this->super_CodeEmitter)._code;
          pSVar5 = pSVar9->next;
          pCVar2->_unresolvedLabelsCount = pCVar2->_unresolvedLabelsCount - 1;
          if ((pCVar2->_baseHeap)._zone == (Zone *)0x0) break;
          pSVar9->next = (pCVar2->_baseHeap)._slots[0];
          (pCVar2->_baseHeap)._slots[0] = pSVar9;
          pSVar9 = pSVar5;
          EVar7 = EVar14;
        }
        DebugUtils::assertionFailed
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/../base/../base/../base/../base/zone.h"
                   ,0x1af,"isInitialized()");
      }
      EStack_150 = 0xe;
    }
    else {
      EStack_150 = 0xc;
    }
    EVar7 = CodeEmitter::setLastError(&this->super_CodeEmitter,EStack_150,(char *)0x0);
    return EVar7;
  }
  DebugUtils::assertionFailed
            ("/workspace/llm4binary/github/license_all_cmakelists_25/satoshigeyuki[P]Centaurus/asmjit/src/asmjit/base/assembler.cpp"
             ,0xbe,"_code != nullptr");
}

Assistant:

Error Assembler::bind(const Label& label) {
  if (_lastError) return _lastError;
  ASMJIT_ASSERT(_code != nullptr);

  LabelEntry* le = _code->getLabelEntry(label);
  if (ASMJIT_UNLIKELY(!le))
    return setLastError(DebugUtils::errored(kErrorInvalidLabel));

  // Label can be bound only once.
  if (ASMJIT_UNLIKELY(le->isBound()))
    return setLastError(DebugUtils::errored(kErrorLabelAlreadyBound));

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled) {
    StringBuilderTmp<256> sb;
    if (le->hasName())
      sb.setFormat("%s:", le->getName());
    else
      sb.setFormat("L%u:", Operand::unpackId(label.getId()));

    size_t binSize = 0;
    if (!_code->_logger->hasOption(Logger::kOptionBinaryForm))
      binSize = Globals::kInvalidIndex;

    Logging::formatLine(sb, nullptr, binSize, 0, 0, getInlineComment());
    _code->_logger->log(sb.getData(), sb.getLength());
  }
#endif // !ASMJIT_DISABLE_LOGGING

  Error err = kErrorOk;
  size_t pos = getOffset();

  LabelLink* link = le->_links;
  LabelLink* prev = nullptr;

  while (link) {
    intptr_t offset = link->offset;
    uint32_t relocId = link->relocId;

    if (relocId != RelocEntry::kInvalidId) {
      // Adjust relocation data.
      RelocEntry* re = _code->_relocations[relocId];
      re->_data += static_cast<uint64_t>(pos);
    }
    else {
      // Not using relocId, this means that we are overwriting a real
      // displacement in the CodeBuffer.
      int32_t patchedValue = static_cast<int32_t>(
        static_cast<intptr_t>(pos) - offset + link->rel);

      // Size of the value we are going to patch. Only BYTE/DWORD is allowed.
      uint32_t size = _bufferData[offset];
      if (size == 4)
        Utils::writeI32u(_bufferData + offset, static_cast<int32_t>(patchedValue));
      else if (size == 1 && Utils::isInt8(patchedValue))
        _bufferData[offset] = static_cast<uint8_t>(patchedValue & 0xFF);
      else
        err = DebugUtils::errored(kErrorInvalidDisplacement);
    }

    prev = link->prev;
    _code->_unresolvedLabelsCount--;
    _code->_baseHeap.release(link, sizeof(LabelLink));

    link = prev;
  }

  // Set as bound.
  le->_sectionId = _section->getId();
  le->_offset = pos;
  le->_links = nullptr;
  resetInlineComment();

  if (err != kErrorOk)
    return setLastError(err);

  return kErrorOk;
}